

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O3

AppStatePtr MakeState_BlockBuilder(void)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_type *psVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  ulong uVar8;
  pointer pHVar9;
  undefined8 *puVar10;
  ulong uVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  size_t __n;
  element_type *in_RDI;
  _func_int **pp_Var13;
  _func_int **pp_Var14;
  long lVar15;
  _Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  pointer pHVar17;
  AppStatePtr AVar18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  *local_118;
  GUILayout *local_110;
  element_type *local_108;
  _func_int *local_100;
  size_type local_f8;
  uint local_f0;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  _func_int *p_Stack_e8;
  undefined1 local_e0 [116];
  undefined4 local_6c;
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  local_68;
  undefined8 local_50;
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  local_48;
  
  local_108 = in_RDI;
  _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x340);
  (_Var7._M_pi)->_M_use_count = 1;
  (_Var7._M_pi)->_M_weak_count = 1;
  (_Var7._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e0f90;
  p_Var1 = _Var7._M_pi + 1;
  *(undefined1 *)&_Var7._M_pi[1]._M_use_count = 0;
  _Var7._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var7._M_pi[2]._M_use_count = 0;
  _Var7._M_pi[2]._M_weak_count = 0;
  _Var7._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__StateBlockBuilder_001e0fe0;
  local_110 = (GUILayout *)(_Var7._M_pi + 3);
  GUILayout::GUILayout(local_110);
  _Var7._M_pi[3]._vptr__Sp_counted_base = (_func_int **)&PTR__LayoutBlockBuilder_001e12f0;
  *(_Atomic_word **)&_Var7._M_pi[7]._M_use_count = &_Var7._M_pi[8]._M_use_count;
  _Var7._M_pi[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&_Var7._M_pi[8]._M_use_count = 0;
  _Var7._M_pi[0xb]._vptr__Sp_counted_base = (_func_int **)(_Var7._M_pi + 0xc);
  _Var7._M_pi[0xb]._M_use_count = 0;
  _Var7._M_pi[0xb]._M_weak_count = 0;
  *(undefined1 *)&_Var7._M_pi[0xc]._vptr__Sp_counted_base = 0;
  *(_Atomic_word **)&_Var7._M_pi[0xe]._M_use_count = &_Var7._M_pi[0xf]._M_use_count;
  _Var7._M_pi[0xf]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&_Var7._M_pi[0xf]._M_use_count = 0;
  _Var7._M_pi[0x12]._vptr__Sp_counted_base = (_func_int **)(_Var7._M_pi + 0x13);
  _Var7._M_pi[0x12]._M_use_count = 0;
  _Var7._M_pi[0x12]._M_weak_count = 0;
  *(undefined1 *)&_Var7._M_pi[0x13]._vptr__Sp_counted_base = 0;
  *(_Atomic_word **)&_Var7._M_pi[0x15]._M_use_count = &_Var7._M_pi[0x16]._M_use_count;
  _Var7._M_pi[0x16]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&_Var7._M_pi[0x16]._M_use_count = 0;
  _Var7._M_pi[0x19]._vptr__Sp_counted_base = (_func_int **)(_Var7._M_pi + 0x1a);
  _Var7._M_pi[0x19]._M_use_count = 0;
  _Var7._M_pi[0x19]._M_weak_count = 0;
  *(undefined1 *)&_Var7._M_pi[0x1a]._vptr__Sp_counted_base = 0;
  memset(&_Var7._M_pi[0x27]._M_use_count,0,0x99);
  *(undefined4 *)((long)&_Var7._M_pi[0x31]._vptr__Sp_counted_base + 4) = 3;
  _Var7._M_pi[0x31]._M_use_count = 0;
  _Var7._M_pi[0x31]._M_weak_count = 0;
  _Var7._M_pi[0x32]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var7._M_pi[0x32]._M_use_count = 0;
  _Var7._M_pi[0x32]._M_weak_count = 0;
  _Var7._M_pi[0x33]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var7._M_pi[0x33]._M_use_count = 0;
  _Var7._M_pi[0x33]._M_weak_count = 0;
  memset(&local_100,0,0x91);
  local_6c = 3;
  local_50 = 0;
  memcpy(&_Var7._M_pi[0x1c]._M_use_count,&local_100,0x98);
  _Var7._M_pi[0x27]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var7._M_pi[0x26]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var7._M_pi[0x26]._M_use_count = 0;
  _Var7._M_pi[0x26]._M_weak_count = 0;
  local_48.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ::~vector(&local_48);
  _Var7._M_pi[0x27]._M_use_count = 0;
  _Var7._M_pi[0x27]._M_weak_count = 0;
  std::
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ::~vector(&local_68);
  local_f0 = 0x74706d65;
  uStack_ec = 0x79;
  local_f8 = 5;
  __n = 0;
  local_100 = (_func_int *)&local_f0;
  memset(local_e0,0,0x91);
  local_50 = CONCAT44(3,(undefined4)local_50);
  pp_Var3 = *(_func_int ***)&_Var7._M_pi[0x26]._M_use_count;
  if (pp_Var3 == _Var7._M_pi[0x27]._vptr__Sp_counted_base) {
    local_120 = _Var7._M_pi + 0x26;
    local_128 = _Var7._M_pi + 0x28;
    pp_Var4 = local_120->_vptr__Sp_counted_base;
    lVar15 = (long)pp_Var3 - (long)pp_Var4;
    if (lVar15 == 0x7fffffffffffffb8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar11 = (lVar15 >> 3) * -0x2c8590b21642c859;
    uVar8 = 1;
    if (pp_Var3 != pp_Var4) {
      uVar8 = uVar11;
    }
    this = (_Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
            *)(uVar8 + uVar11);
    if ((_Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
         *)0xb21642c8590b20 < this) {
      this = (_Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
              *)0xb21642c8590b21;
    }
    if (CARRY8(uVar8,uVar11)) {
      this = (_Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
              *)0xb21642c8590b21;
    }
    pHVar9 = std::
             _Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
             ::_M_allocate(this,__n);
    psVar2 = (size_type *)((long)pHVar9 + lVar15);
    puVar10 = (undefined8 *)((long)pHVar9 + lVar15 + 0x10);
    *(undefined8 **)((long)pHVar9 + lVar15) = puVar10;
    if (local_100 == (_func_int *)&local_f0) {
      *puVar10 = CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0));
      *(_func_int **)((long)pHVar9 + lVar15 + 0x18) = p_Stack_e8;
    }
    else {
      *psVar2 = (size_type)local_100;
      psVar2[2] = CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0));
    }
    psVar2[1] = local_f8;
    local_f8 = 0;
    local_f0 = local_f0 & 0xffffff00;
    local_118 = this;
    local_100 = (_func_int *)&local_f0;
    memcpy(psVar2 + 4,local_e0,0x98);
    _Var12._M_pi = extraout_RDX_00;
    pHVar17 = pHVar9;
    if (pp_Var3 != pp_Var4) {
      pp_Var13 = pp_Var4 + 2;
      paVar6 = &(pHVar9->label).field_2;
      do {
        paVar16 = paVar6;
        (((string *)(paVar16 + -1))->_M_dataplus)._M_p = (pointer)paVar16;
        if (pp_Var13 == (_func_int **)pp_Var13[-2]) {
          p_Var5 = pp_Var13[1];
          paVar16->_M_allocated_capacity = (size_type)*pp_Var13;
          *(_func_int **)((long)paVar16 + 8) = p_Var5;
        }
        else {
          (((string *)(paVar16 + -1))->_M_dataplus)._M_p = (pointer)pp_Var13[-2];
          paVar16->_M_allocated_capacity = (size_type)*pp_Var13;
        }
        *(_func_int **)((long)paVar16 + -8) = pp_Var13[-1];
        pp_Var13[-2] = (_func_int *)pp_Var13;
        pp_Var13[-1] = (_func_int *)0x0;
        *(undefined1 *)pp_Var13 = 0;
        memcpy(paVar16 + 1,pp_Var13 + 2,0x98);
        pp_Var14 = pp_Var13 + 0x15;
        pp_Var13 = pp_Var13 + 0x17;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar16 + 0xb8);
      } while (pp_Var14 != pp_Var3);
      pHVar17 = (pointer)((long)paVar16 + 0xa8);
      _Var12._M_pi = extraout_RDX_01;
    }
    if (pp_Var4 != (_func_int **)0x0) {
      operator_delete(pp_Var4,(long)_Var7._M_pi[0x27]._vptr__Sp_counted_base - (long)pp_Var4);
      _Var12._M_pi = extraout_RDX_02;
    }
    _Var7._M_pi[0x26]._vptr__Sp_counted_base = (_func_int **)pHVar9;
    *(pointer *)&_Var7._M_pi[0x26]._M_use_count = pHVar17 + 1;
    _Var7._M_pi[0x27]._vptr__Sp_counted_base = (_func_int **)(pHVar9 + (long)local_118);
    if (local_100 != (_func_int *)&local_f0) {
      operator_delete(local_100,CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0)) + 1);
      _Var12._M_pi = extraout_RDX_03;
    }
  }
  else {
    *pp_Var3 = (_func_int *)(pp_Var3 + 2);
    if (local_100 == (_func_int *)&local_f0) {
      pp_Var3[2] = (_func_int *)CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0));
      pp_Var3[3] = p_Stack_e8;
    }
    else {
      *pp_Var3 = local_100;
      pp_Var3[2] = (_func_int *)CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0));
    }
    pp_Var3[1] = (_func_int *)0x5;
    memcpy(pp_Var3 + 4,local_e0,0x98);
    *(long *)&_Var7._M_pi[0x26]._M_use_count = *(long *)&_Var7._M_pi[0x26]._M_use_count + 0xb8;
    _Var12._M_pi = extraout_RDX;
  }
  *(undefined4 *)((long)&_Var7._M_pi[0x31]._vptr__Sp_counted_base + 4) = 0;
  if ((*(long *)&_Var7._M_pi[2]._M_use_count == 0) ||
     (*(int *)(*(long *)&_Var7._M_pi[2]._M_use_count + 8) == 0)) {
    _Var7._M_pi[2]._vptr__Sp_counted_base = (_func_int **)p_Var1;
    _Stack_130._M_pi = _Var7._M_pi;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&_Var7._M_pi[2]._M_use_count,&_Stack_130)
    ;
    _Var12._M_pi = extraout_RDX_04;
    _Var7._M_pi = _Stack_130._M_pi;
  }
  local_108->_vptr_AppState = (_func_int **)p_Var1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&local_108->m_completed = _Var7._M_pi;
  AVar18.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var12._M_pi;
  AVar18.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_108;
  return (AppStatePtr)AVar18.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AppStatePtr MakeState_BlockBuilder()
{
    return std::make_shared<StateBlockBuilder>();
}